

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

ktx_error_code_e __thiscall
anon_unknown.dwarf_c382::TextureWriterTestHelper<unsigned_short,_2U,_33324U>::copyImagesToTexture
          (TextureWriterTestHelper<unsigned_short,_2U,_33324U> *this,ktxTexture1 *texture)

{
  long lVar1;
  long lVar2;
  ktx_error_code_e kVar3;
  ktx_error_code_e kVar4;
  uint uVar5;
  pointer pvVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  pvVar6 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = 0;
  kVar4 = KTX_SUCCESS;
  do {
    uVar11 = (ulong)uVar10;
    if ((ulong)(((long)(this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                       super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) <= uVar11)
    {
      return kVar4;
    }
    uVar7 = 0;
    while( true ) {
      uVar8 = (ulong)uVar7;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pvVar6[uVar11].
                                  super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&pvVar6[uVar11].
                            super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data) / 0x18) <= uVar8) break;
      uVar5 = 0;
      kVar3 = kVar4;
      do {
        kVar4 = kVar3;
        uVar9 = (ulong)uVar5;
        pvVar6 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                 super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar1 = *(long *)&pvVar6[uVar11].
                          super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar2 = *(long *)(lVar1 + uVar8 * 0x18);
        if ((ulong)((*(long *)(lVar1 + 8 + uVar8 * 0x18) - lVar2) / 0x18) <= uVar9)
        goto LAB_0012bd31;
        lVar1 = *(long *)(lVar2 + uVar9 * 0x18);
        kVar4 = ktxTexture1_SetImageFromMemory
                          (texture,uVar11,uVar8,uVar9,lVar1,
                           *(long *)(lVar2 + 8 + uVar9 * 0x18) - lVar1);
        uVar5 = uVar5 + 1;
        kVar3 = KTX_SUCCESS;
      } while (kVar4 == KTX_SUCCESS);
      pvVar6 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
               super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
LAB_0012bd31:
      uVar7 = uVar7 + 1;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

KTX_error_code
    copyImagesToTexture(ktxTexture1* texture) {
        KTX_error_code result = KTX_SUCCESS;

        for (ktx_uint32_t level = 0; level < images.size(); level++) {
            for (ktx_uint32_t layer = 0; layer < images[level].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    ktx_size_t imageBytes = images[level][layer][faceSlice].size() * sizeof(component_type);
                    ktx_uint8_t* imageDataPtr = (ktx_uint8_t*)(images[level][layer][faceSlice].data());
                    result = ktxTexture1_SetImageFromMemory(texture,
                                                            level, layer,
                                                            faceSlice,
                                                            imageDataPtr,
                                                            imageBytes);
                   if (result != KTX_SUCCESS)
                       break;
                }
            }
        }
        return result;
    }